

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZElementMatrixT<double> *ek,
          TPZElementMatrixT<double> *ef)

{
  long lVar1;
  TPZElementMatrixT<double> *pTVar2;
  TPZElementMatrixT<double> *pTVar3;
  int64_t iVar4;
  _func_int **pp_Var5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  TPZIntPoints *rval;
  uint uVar12;
  long lVar13;
  long lVar14;
  TPZCompElSide *pTVar15;
  int *piVar16;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_4> intorder;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_6> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_32080;
  TPZElementMatrixT<double> *pTStack_32078;
  TPZElementMatrixT<double> *pTStack_32070;
  int iStack_32064;
  double dStack_32060;
  undefined **ppuStack_32058;
  TPZGeoEl *pTStack_32050;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *pTStack_32048;
  TPZManVector<int,_4> TStack_32040;
  undefined **ppuStack_32010;
  long *plStack_32008;
  TPZVec<double> TStack_32000;
  double adStack_31fe0 [4];
  _func_int **pp_Stack_31fc0;
  double dStack_31fb8;
  TPZManVector<int,_4> TStack_31fb0;
  TPZFMatrix<double> TStack_31f80;
  TPZFMatrix<double> TStack_31ef0;
  TPZFMatrix<double> TStack_31e60;
  TPZManVector<TPZTransform<double>,_10> TStack_31dd0;
  TPZManVector<TPZMaterialDataT<double>,_6> TStack_30d70;
  
  pTStack_32078 = ek;
  pTStack_32070 = ef;
  lVar10 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar10 == 0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(lVar10,&TPZMaterial::typeinfo,
                                     &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
  }
  if (lVar10 == 0 || plVar11 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoCube, TVar = double]"
               ,0xa0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
    TPZElementMatrixT<double>::Reset(pTStack_32078,(TPZCompMesh *)0x0,Unknown);
    TPZElementMatrixT<double>::Reset(pTStack_32070,(TPZCompMesh *)0x0,Unknown);
    return;
  }
  lVar10 = __dynamic_cast(lVar10,&TPZMaterial::typeinfo,&TPZNullMaterialCS<double>::typeinfo,0);
  pTVar2 = pTStack_32078;
  if (lVar10 == 0) {
    (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xf8))
              (this,pTStack_32078,pTStack_32070);
    iVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                      (this);
    if (iVar6 != 0) {
      TPZManVector<TPZMaterialDataT<double>,_6>::TPZManVector(&TStack_30d70,0);
      lVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      (*TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])(&TStack_30d70,lVar10);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
                (this,&TStack_30d70,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_31dd0,0);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))(this);
      iVar6 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                        (this);
      TStack_32080.fRef = (TPZReference *)operator_new(0x10);
      (TStack_32080.fRef)->fPointer = (TPZIntPoints *)0x0;
      ((TStack_32080.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      LOCK();
      ((TStack_32080.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      plStack_32008 = plVar11;
      TPZVec<double>::TPZVec(&TStack_32000,0);
      TStack_32000.fStore = adStack_31fe0;
      ppuStack_32010 = &PTR__TPZManVector_018a32e0;
      TStack_32000._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a32e0;
      TStack_32000.fNElements = 3;
      TStack_32000.fNAlloc = 0;
      adStack_31fe0[0] = 0.0;
      adStack_31fe0[1] = 0.0;
      adStack_31fe0[2] = 0.0;
      dStack_32060 = 0.0;
      TPZVec<int>::TPZVec(&TStack_32040.super_TPZVec<int>,0);
      TStack_32040.super_TPZVec<int>.fStore = TStack_32040.fExtAlloc;
      ppuStack_32058 = &PTR__TPZManVector_018e5370;
      TStack_32040.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5370;
      TStack_32040.super_TPZVec<int>.fNElements = 0;
      TStack_32040.super_TPZVec<int>.fNAlloc = 0;
      pTStack_32048 = this;
      if (0 < lVar10) {
        lVar13 = 17000;
        lVar14 = 0;
        do {
          lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar14);
          if (lVar1 == 0) {
            plVar11 = (long *)0x0;
          }
          else {
            plVar11 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                             &TPZInterpolationSpace::typeinfo,0);
          }
          if (plVar11 != (long *)0x0) {
            TPZManVector<int,_4>::Resize
                      (&TStack_32040,TStack_32040.super_TPZVec<int>.fNElements + 1);
            iVar4 = TStack_32040.super_TPZVec<int>.fNElements;
            uVar7 = (**(code **)(*plVar11 + 0x268))(plVar11);
            *(undefined4 *)
             ((long)((TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                    super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
             lVar13 + -0x30) = uVar7;
            *(undefined4 *)
             ((long)TStack_32040.super_TPZVec<int>.fStore + ((iVar4 << 0x20) + -0x100000000 >> 0x1e)
             ) = uVar7;
            this = pTStack_32048;
          }
          lVar14 = lVar14 + 0x10;
          lVar13 = lVar13 + 0x8230;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      iStack_32064 = (**(code **)(*plStack_32008 + 0x48))(plStack_32008,&TStack_32040);
      pTStack_32050 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar8 = (**(code **)(*(long *)pTStack_32050 + 0xf0))();
      rval = (TPZIntPoints *)
             (**(code **)(*(long *)pTStack_32050 + 0x70))(pTStack_32050,iVar8 + -1,iStack_32064);
      TPZAutoPointer<TPZIntPoints>::operator=(&TStack_32080,rval);
      TPZManVector<int,_4>::TPZManVector(&TStack_31fb0,(long)iVar6,&iStack_32064);
      (*(TStack_32080.fRef)->fPointer->_vptr_TPZIntPoints[5])
                ((TStack_32080.fRef)->fPointer,&TStack_31fb0,0);
      uVar9 = (*(TStack_32080.fRef)->fPointer->_vptr_TPZIntPoints[3])();
      if (1000 < (int)uVar9) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                   ,0x36d);
      }
      TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_31e60.fElem = (double *)0x0;
      TStack_31e60.fGiven = (double *)0x0;
      TStack_31e60.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_31e60.fPivot.super_TPZVec<int>,0);
      TStack_31e60.fPivot.super_TPZVec<int>.fStore = TStack_31e60.fPivot.fExtAlloc;
      TStack_31e60.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_31e60.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_31e60.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_31e60.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_31e60.fWork.fStore = (double *)0x0;
      TStack_31e60.fWork.fNElements = 0;
      TStack_31e60.fWork.fNAlloc = 0;
      TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_31ef0.fElem = (double *)0x0;
      TStack_31ef0.fGiven = (double *)0x0;
      TStack_31ef0.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_31ef0.fPivot.super_TPZVec<int>,0);
      TStack_31ef0.fPivot.super_TPZVec<int>.fStore = TStack_31ef0.fPivot.fExtAlloc;
      TStack_31ef0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_31ef0.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_31ef0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_31ef0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_31ef0.fWork.fStore = (double *)0x0;
      TStack_31ef0.fWork.fNElements = 0;
      TStack_31ef0.fWork.fNAlloc = 0;
      TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
      TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
      TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      TStack_31f80.fElem = (double *)0x0;
      TStack_31f80.fGiven = (double *)0x0;
      TStack_31f80.fSize = 0;
      TPZVec<int>::TPZVec(&TStack_31f80.fPivot.super_TPZVec<int>,0);
      TStack_31f80.fPivot.super_TPZVec<int>.fStore = TStack_31f80.fPivot.fExtAlloc;
      TStack_31f80.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
      ;
      TStack_31f80.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_31f80.fPivot.super_TPZVec<int>.fNAlloc = 0;
      pp_Stack_31fc0 = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_31f80.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      TStack_31f80.fWork.fStore = (double *)0x0;
      TStack_31f80.fWork.fNElements = 0;
      TStack_31f80.fWork.fNAlloc = 0;
      if (0 < (int)uVar9) {
        pTStack_32078 = (TPZElementMatrixT<double> *)&pTStack_32078->fMat;
        pTStack_32070 = (TPZElementMatrixT<double> *)&pTStack_32070->fMat;
        uVar12 = 0;
        do {
          (*(TStack_32080.fRef)->fPointer->_vptr_TPZIntPoints[4])
                    ((TStack_32080.fRef)->fPointer,(ulong)uVar12,&TStack_32000,&dStack_32060);
          TPZGeoEl::Jacobian(pTStack_32050,&TStack_32000,&TStack_31e60,&TStack_31ef0,&dStack_31fb8,
                             &TStack_31f80);
          dStack_32060 = ABS(dStack_31fb8) * dStack_32060;
          lVar10 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
          if (0 < lVar10) {
            pTVar15 = (pTStack_32048->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
            piVar16 = &((TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                       super_TPZMaterialData).intLocPtIndex;
            do {
              if (pTVar15->fEl != (TPZCompEl *)0x0) {
                lVar13 = __dynamic_cast(pTVar15->fEl,&TPZCompEl::typeinfo,
                                        &TPZInterpolationSpace::typeinfo,0);
                if (lVar13 != 0) {
                  *piVar16 = uVar12;
                }
              }
              piVar16 = piVar16 + 0x208c;
              pTVar15 = pTVar15 + 1;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          this = pTStack_32048;
          (**(code **)(*(long *)&(pTStack_32048->super_TPZMultiphysicsElement).super_TPZCompEl +
                      0x2a8))(pTStack_32048,&TStack_32000,&TStack_31dd0,&TStack_30d70);
          (**(code **)(*plStack_32008 + 0x68))
                    (dStack_32060,plStack_32008,&TStack_30d70,pTStack_32078,pTStack_32070);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      CleanupMaterialDataT<double>(this,&TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_31f80);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_31ef0);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_31e60);
      if (TStack_31fb0.super_TPZVec<int>.fStore == TStack_31fb0.fExtAlloc) {
        TStack_31fb0.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_31fb0.super_TPZVec<int>.fNAlloc = 0;
      TStack_31fb0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_31fb0.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_31fb0.super_TPZVec<int>.fStore);
      }
      pp_Var5 = pp_Stack_31fc0;
      if (TStack_32040.super_TPZVec<int>.fStore == TStack_32040.fExtAlloc) {
        TStack_32040.super_TPZVec<int>.fStore = (int *)0x0;
      }
      TStack_32040.super_TPZVec<int>.fNAlloc = 0;
      TStack_32040.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (TStack_32040.super_TPZVec<int>.fStore != (int *)0x0) {
        operator_delete__(TStack_32040.super_TPZVec<int>.fStore);
      }
      if (TStack_32000.fStore == adStack_31fe0) {
        TStack_32000.fStore = (double *)0x0;
      }
      TStack_32000.fNAlloc = 0;
      TStack_32000._vptr_TPZVec = pp_Var5;
      if (TStack_32000.fStore != (double *)0x0) {
        operator_delete__(TStack_32000.fStore);
      }
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_32080);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_31dd0);
      TPZManVector<TPZMaterialDataT<double>,_6>::~TPZManVector(&TStack_30d70);
    }
  }
  else {
    TPZElementMatrixT<double>::Reset(pTStack_32078,(TPZCompMesh *)0x0,Unknown);
    pTVar3 = pTStack_32070;
    TPZElementMatrixT<double>::Reset(pTStack_32070,(TPZCompMesh *)0x0,Unknown);
    (pTVar2->super_TPZElementMatrix).fType = EK;
    (pTVar3->super_TPZElementMatrix).fType = EF;
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}